

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O1

void __thiscall
PerspectiveCamera::PerspectiveCamera
          (PerspectiveCamera *this,Vec3f pos,Vec3f center,Vec3f up,float fovy,float aspect)

{
  undefined8 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  undefined1 auVar16 [64];
  undefined1 auVar17 [16];
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  float fVar21;
  float fVar22;
  float fVar23;
  
  auVar20._4_60_ = up._12_60_;
  auVar20._0_4_ = up.z;
  auVar19 = auVar20._0_16_;
  auVar18._8_56_ = up._8_56_;
  auVar18._0_8_ = up._0_8_;
  auVar16._8_56_ = center._8_56_;
  auVar16._0_8_ = center._0_8_;
  auVar14._8_56_ = pos._8_56_;
  auVar14._0_8_ = pos._0_8_;
  uVar1 = vmovlps_avx(auVar14._0_16_);
  (this->pos).x = (float)(int)uVar1;
  (this->pos).y = (float)(int)((ulong)uVar1 >> 0x20);
  (this->pos).z = pos.z;
  auVar8 = vsubps_avx(auVar16._0_16_,auVar14._0_16_);
  auVar15 = vmovshdup_avx(auVar8);
  fVar10 = center.z - pos.z;
  fVar21 = auVar15._0_4_;
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar21 * fVar21)),auVar8,auVar8);
  auVar15 = vfmadd231ss_fma(auVar15,ZEXT416((uint)fVar10),ZEXT416((uint)fVar10));
  auVar17 = auVar18._0_16_;
  if (auVar15._0_4_ < 0.0) {
    fVar9 = sqrtf(auVar15._0_4_);
    auVar19 = ZEXT416((uint)auVar20._0_4_);
  }
  else {
    auVar15 = vsqrtss_avx(auVar15,auVar15);
    fVar9 = auVar15._0_4_;
  }
  fVar9 = 1.0 / fVar9;
  auVar15 = vinsertps_avx(ZEXT416((uint)(auVar8._0_4_ * fVar9)),ZEXT416((uint)(fVar21 * fVar9)),0x10
                         );
  fVar10 = fVar10 * fVar9;
  uVar1 = vmovlps_avx(auVar15);
  (this->dir).x = (float)(int)uVar1;
  (this->dir).y = (float)(int)((ulong)uVar1 >> 0x20);
  (this->dir).z = fVar10;
  uVar1 = vmovlps_avx(auVar17);
  (this->up).x = (float)(int)uVar1;
  (this->up).y = (float)(int)((ulong)uVar1 >> 0x20);
  (this->up).z = auVar19._0_4_;
  (this->dir_top_left).x = 0.0;
  (this->dir_top_left).y = 0.0;
  *(undefined8 *)&(this->dir_top_left).z = 0;
  (this->screen_du).y = 0.0;
  (this->screen_du).z = 0.0;
  (this->screen_dv).x = 0.0;
  (this->screen_dv).y = 0.0;
  (this->screen_dv).z = 0.0;
  fVar21 = (this->dir).y;
  auVar15 = ZEXT416((uint)(this->dir).x);
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar21 * fVar21)),auVar15,auVar15);
  auVar15 = vfmadd231ss_fma(auVar15,ZEXT416((uint)fVar10),ZEXT416((uint)fVar10));
  if (auVar15._0_4_ < 0.0) {
    fVar10 = sqrtf(auVar15._0_4_);
    auVar19 = ZEXT416((uint)auVar20._0_4_);
  }
  else {
    auVar15 = vsqrtss_avx(auVar15,auVar15);
    fVar10 = auVar15._0_4_;
  }
  fVar10 = 1.0 / fVar10;
  fVar21 = fVar10 * (this->dir).x;
  fVar9 = fVar10 * (this->dir).y;
  fVar10 = fVar10 * (this->dir).z;
  auVar15 = vmovshdup_avx(auVar17);
  auVar8 = vfmsub231ss_fma(ZEXT416((uint)(auVar15._0_4_ * fVar10)),ZEXT416((uint)fVar9),auVar19);
  auVar17 = vfmsub231ss_fma(ZEXT416((uint)(fVar21 * auVar19._0_4_)),ZEXT416((uint)fVar10),auVar17);
  fVar22 = auVar17._0_4_;
  auVar17 = vfmsub231ss_fma(ZEXT416((uint)(up.x * fVar9)),ZEXT416((uint)fVar21),auVar15);
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar22 * fVar22)),auVar8,auVar8);
  auVar15 = vfmadd231ss_fma(auVar15,auVar17,auVar17);
  if (auVar15._0_4_ < 0.0) {
    fVar11 = sqrtf(auVar15._0_4_);
  }
  else {
    auVar15 = vsqrtss_avx(auVar15,auVar15);
    fVar11 = auVar15._0_4_;
  }
  fVar11 = 1.0 / fVar11;
  fVar2 = fVar11 * auVar8._0_4_;
  fVar22 = fVar22 * fVar11;
  fVar11 = fVar11 * auVar17._0_4_;
  auVar8 = vfnmadd231ss_fma(ZEXT416((uint)(fVar9 * fVar11)),ZEXT416((uint)fVar22),
                            ZEXT416((uint)fVar10));
  auVar15 = vfnmadd231ss_fma(ZEXT416((uint)(fVar10 * fVar2)),ZEXT416((uint)fVar11),
                             ZEXT416((uint)fVar21));
  fVar23 = auVar15._0_4_;
  auVar17 = vfnmadd231ss_fma(ZEXT416((uint)(fVar21 * fVar22)),ZEXT416((uint)fVar2),
                             ZEXT416((uint)fVar9));
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar23 * fVar23)),auVar8,auVar8);
  auVar15 = vfmadd231ss_fma(auVar15,auVar17,auVar17);
  if (auVar15._0_4_ < 0.0) {
    fVar12 = sqrtf(auVar15._0_4_);
  }
  else {
    auVar15 = vsqrtss_avx(auVar15,auVar15);
    fVar12 = auVar15._0_4_;
  }
  fVar12 = 1.0 / fVar12;
  fVar3 = fVar12 * auVar8._0_4_;
  fVar4 = fVar12 * auVar17._0_4_;
  fVar13 = sinf(fovy * 0.5 * 0.017453292);
  fVar13 = fVar13 + fVar13;
  fVar5 = fVar13 * aspect;
  fVar6 = fVar5 * 0.5;
  fVar7 = fVar13 * 0.5;
  auVar15 = vinsertps_avx(ZEXT416((uint)((fVar6 * fVar2 + fVar21) - fVar3 * fVar7)),
                          ZEXT416((uint)((fVar6 * fVar22 + fVar9) - fVar23 * fVar12 * fVar7)),0x10);
  uVar1 = vmovlps_avx(auVar15);
  (this->dir_top_left).x = (float)(int)uVar1;
  (this->dir_top_left).y = (float)(int)((ulong)uVar1 >> 0x20);
  (this->dir_top_left).z = (fVar6 * fVar11 + fVar10) - fVar4 * fVar7;
  auVar15 = vinsertps_avx(ZEXT416((uint)(fVar5 * -fVar2)),ZEXT416((uint)(fVar5 * -fVar22)),0x10);
  uVar1 = vmovlps_avx(auVar15);
  (this->screen_du).x = (float)(int)uVar1;
  (this->screen_du).y = (float)(int)((ulong)uVar1 >> 0x20);
  (this->screen_du).z = fVar5 * -fVar11;
  auVar15 = vinsertps_avx(ZEXT416((uint)(fVar3 * fVar13)),ZEXT416((uint)(fVar23 * fVar12 * fVar13)),
                          0x10);
  uVar1 = vmovlps_avx(auVar15);
  (this->screen_dv).x = (float)(int)uVar1;
  (this->screen_dv).y = (float)(int)((ulong)uVar1 >> 0x20);
  (this->screen_dv).z = fVar4 * fVar13;
  return;
}

Assistant:

PerspectiveCamera::PerspectiveCamera(Vec3f pos, Vec3f center, Vec3f up, float fovy, float aspect)
	: pos(pos), dir((center - pos).normalized()), up(up)
{
	Vec3f dz = dir.normalized();
	Vec3f dx = -dz.cross(up).normalized();
	Vec3f dy = dx.cross(dz).normalized();
	float dim_y = 2.f * std::sin((fovy / 2.f) * (static_cast<float>(M_PI) / 180.f));
	float dim_x = dim_y * aspect;
	dir_top_left = dz - 0.5f * dim_x * dx - 0.5f * dim_y * dy;
	screen_du = dx * dim_x;
	screen_dv = dy * dim_y;
}